

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall libcellml::Importer::Importer(Importer *this)

{
  ImporterImpl *pIVar1;
  Importer *this_local;
  
  pIVar1 = (ImporterImpl *)operator_new(0xb0);
  (pIVar1->mImports).
  super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar1->mImports).
  super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar1->mLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pIVar1->mImports).
  super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar1->mLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (pIVar1->mLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  *(undefined8 *)&(pIVar1->mLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (pIVar1->mLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pIVar1->mImporter = (Importer *)0x0;
  *(undefined8 *)&(pIVar1->mLibrary)._M_t._M_impl = 0;
  (pIVar1->super_LoggerImpl).mIssues.
  super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar1->super_LoggerImpl).mIssues.
  super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar1->super_LoggerImpl).mMessages.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pIVar1->super_LoggerImpl).mIssues.
  super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar1->super_LoggerImpl).mMessages.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pIVar1->super_LoggerImpl).mMessages.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pIVar1->super_LoggerImpl).mWarnings.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pIVar1->super_LoggerImpl).mWarnings.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pIVar1->super_LoggerImpl).mErrors.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pIVar1->super_LoggerImpl).mWarnings.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pIVar1->super_LoggerImpl).mErrors.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pIVar1->super_LoggerImpl).mErrors.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ImporterImpl::ImporterImpl(pIVar1);
  Logger::Logger(&this->super_Logger,(LoggerImpl *)pIVar1);
  Strict::Strict(&this->super_Strict);
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__Importer_00469df8;
  (this->super_Strict)._vptr_Strict = (_func_int **)&DAT_00469e18;
  pIVar1 = pFunc(this);
  pIVar1->mImporter = this;
  Strict::setStrict(&this->super_Strict,true);
  return;
}

Assistant:

Importer::Importer()
    : Logger(new Importer::ImporterImpl())
{
    pFunc()->mImporter = this;
    setStrict(true);
}